

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall Pl_Flate::finish(Pl_Flate *this)

{
  bool bVar1;
  pointer pMVar2;
  runtime_error *this_00;
  element_type *peVar3;
  Pipeline *pPVar4;
  exception *e;
  int local_30;
  uchar local_29;
  int err;
  uchar buf [1];
  z_stream *zstream;
  Pl_Flate *this_local;
  
  pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  if (pMVar2->written <= (anonymous_namespace)::memory_limit_) {
    pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                       (&this->m);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pMVar2->zopfli_buf);
    if (bVar1) {
      finish_zopfli(this);
    }
    else {
      pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
               operator->(&this->m);
      peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)pMVar2);
      if (peVar3 != (element_type *)0x0) {
        pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        if ((pMVar2->initialized & 1U) != 0) {
          pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                   operator->(&this->m);
          _err = pMVar2->zdata;
          local_29 = '\0';
          handleData(this,&local_29,0,4);
          local_30 = 0;
          pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                   operator->(&this->m);
          if (pMVar2->action == a_deflate) {
            local_30 = deflateEnd(_err);
          }
          else {
            local_30 = inflateEnd(_err);
          }
          pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                   operator->(&this->m);
          pMVar2->initialized = false;
          checkError(this,"End",local_30);
        }
        std::shared_ptr<unsigned_char>::shared_ptr((shared_ptr<unsigned_char> *)&e,(nullptr_t)0x0);
        pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        std::shared_ptr<unsigned_char>::operator=(&pMVar2->outbuf,(shared_ptr<unsigned_char> *)&e);
        std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&e);
      }
    }
    pPVar4 = Pipeline::next(&this->super_Pipeline);
    (*pPVar4->_vptr_Pipeline[3])();
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"PL_Flate memory limit exceeded");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Pl_Flate::finish()
{
    if (m->written > memory_limit_) {
        throw std::runtime_error("PL_Flate memory limit exceeded");
    }
    try {
        if (m->zopfli_buf) {
            finish_zopfli();
        } else if (m->outbuf.get()) {
            if (m->initialized) {
                z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
                unsigned char buf[1];
                buf[0] = '\0';
                handleData(buf, 0, Z_FINISH);
                int err = Z_OK;
                if (m->action == a_deflate) {
                    err = deflateEnd(&zstream);
                } else {
                    err = inflateEnd(&zstream);
                }
                m->initialized = false;
                checkError("End", err);
            }

            m->outbuf = nullptr;
        }
    } catch (std::exception& e) {
        try {
            next()->finish();
        } catch (...) {
            // ignore secondary exception
        }
        throw std::runtime_error(e.what());
    }
    next()->finish();
}